

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O3

void Fra_FraigInductionRewrite(Fra_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *pAVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  Aig_Man_t *pAVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  Vec_Ptr_t *pVVar16;
  timespec ts;
  timespec local_30;
  
  iVar5 = clock_gettime(3,&local_30);
  if (iVar5 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pAVar7 = Dar_ManRewriteDefault(p->pManFraig);
  if (p->pManFraig->nRegs != pAVar7->nRegs) {
    __assert_fail("p->pManFraig->nRegs == pTemp->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x3f,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  if (p->pManFraig->nAsserts != pAVar7->nAsserts) {
    __assert_fail("p->pManFraig->nAsserts == pTemp->nAsserts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x40,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  iVar5 = p->pManAig->nObjs[2];
  iVar1 = p->pManAig->nRegs;
  memset(p->pMemFraig,0,(long)p->nFramesAll * (long)p->nSizeAlloc * 8);
  pAVar2 = p->pManAig->pConst1;
  pvVar3 = (pAVar2->field_5).pData;
  *(Aig_Obj_t **)
   (*(long *)((long)pvVar3 + 0x20) +
   ((long)*(int *)((long)pvVar3 + 0x18) * (long)pAVar2->Id + (long)p->pPars->nFramesK) * 8) =
       pAVar7->pConst1;
  pAVar11 = p->pManAig;
  iVar14 = pAVar11->nRegs;
  uVar6 = pAVar11->nObjs[2] - iVar14;
  uVar15 = (ulong)uVar6;
  if (uVar6 != 0 && iVar14 <= pAVar11->nObjs[2]) {
    lVar8 = 0;
    do {
      if (pAVar11->vCis->nSize <= lVar8) goto LAB_005d4acf;
      iVar14 = p->pPars->nFramesK;
      uVar15 = (ulong)(uint)(iVar14 * (iVar5 - iVar1)) + lVar8;
      iVar13 = (int)uVar15;
      if ((iVar13 < 0) || (pAVar7->vCis->nSize <= iVar13)) goto LAB_005d4acf;
      pvVar3 = pAVar11->vCis->pArray[lVar8];
      lVar4 = *(long *)((long)pvVar3 + 0x28);
      *(void **)(*(long *)(lVar4 + 0x20) +
                (long)(*(int *)(lVar4 + 0x18) * *(int *)((long)pvVar3 + 0x24) + iVar14) * 8) =
           pAVar7->vCis->pArray[uVar15 & 0xffffffff];
      lVar8 = lVar8 + 1;
      pAVar11 = p->pManAig;
      iVar14 = pAVar11->nRegs;
      uVar15 = (long)pAVar11->nObjs[2] - (long)iVar14;
    } while (lVar8 < (long)uVar15);
  }
  uVar9 = (ulong)(uint)pAVar7->nAsserts;
  if (iVar14 != pAVar7->nObjs[3] - pAVar7->nAsserts) {
    __assert_fail("Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x47,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  pVVar16 = pAVar11->vCis;
  if ((int)uVar15 < pVVar16->nSize) {
    uVar12 = uVar15 & 0xffffffff;
    do {
      if ((((int)uVar15 < 0) || ((int)uVar9 < 0)) || (pAVar7->vCos->nSize <= (int)uVar9)) {
LAB_005d4acf:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar8 = *(long *)((long)pVVar16->pArray[uVar12] + 0x28);
      *(undefined8 *)
       (*(long *)(lVar8 + 0x20) +
       ((long)*(int *)(lVar8 + 0x18) * (long)*(int *)((long)pVVar16->pArray[uVar12] + 0x24) +
       (long)p->pPars->nFramesK) * 8) = *(undefined8 *)((long)pAVar7->vCos->pArray[uVar9] + 8);
      uVar12 = uVar12 + 1;
      pVVar16 = p->pManAig->vCis;
      uVar9 = uVar9 + 1;
    } while ((int)uVar12 < pVVar16->nSize);
  }
  Aig_ManStop(p->pManFraig);
  p->pManFraig = pAVar7;
  iVar5 = clock_gettime(3,&local_30);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeRwr = p->timeRwr + lVar8 + lVar10;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs AIG rewriting on the constraint manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_FraigInductionRewrite( Fra_Man_t * p )
{
    Aig_Man_t * pTemp;
    Aig_Obj_t * pObj, * pObjPo;
    int nTruePis, k, i;
    abctime clk = Abc_Clock();
    // perform AIG rewriting on the speculated frames
//    pTemp = Dar_ManRwsat( pTemp, 1, 0 );
    pTemp = Dar_ManRewriteDefault( p->pManFraig );
//    printf( "Before = %6d.  After = %6d.\n", Aig_ManNodeNum(p->pManFraig), Aig_ManNodeNum(pTemp) ); 
//Aig_ManDumpBlif( p->pManFraig, "1.blif", NULL, NULL );
//Aig_ManDumpBlif( pTemp, "2.blif", NULL, NULL );
//    Fra_FramesWriteCone( pTemp );
//    Aig_ManStop( pTemp );
    // transfer PI/register pointers
    assert( p->pManFraig->nRegs == pTemp->nRegs );
    assert( p->pManFraig->nAsserts == pTemp->nAsserts );
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), p->pPars->nFramesK, Aig_ManConst1(pTemp) );
    Aig_ManForEachPiSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ManCi(pTemp,nTruePis*p->pPars->nFramesK+i) );
    k = 0;
    assert( Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        pObjPo = Aig_ManCo(pTemp, pTemp->nAsserts + k++);
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ObjChild0(pObjPo) );
    }
    // exchange
    Aig_ManStop( p->pManFraig );
    p->pManFraig = pTemp;
p->timeRwr += Abc_Clock() - clk;
}